

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * __thiscall pugi::xpath_variable::name(xpath_variable *this)

{
  xpath_variable *this_local;
  
  switch(this->_type) {
  case xpath_type_node_set:
    this_local = (xpath_variable *)&this[3]._next;
    break;
  case xpath_type_number:
    this_local = (xpath_variable *)&this[1]._next;
    break;
  case xpath_type_string:
    this_local = (xpath_variable *)&this[1]._next;
    break;
  case xpath_type_boolean:
    this_local = (xpath_variable *)((long)&this[1]._type + 1);
    break;
  default:
    __assert_fail("false && \"Invalid variable type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JeffIrwin[P]maph/submodules/colormapper/submodules/pugixml/src/pugixml.cpp"
                  ,0x3038,"const char_t *pugi::xpath_variable::name() const");
  }
  return (char_t *)this_local;
}

Assistant:

PUGI__FN const char_t* xpath_variable::name() const
	{
		switch (_type)
		{
		case xpath_type_node_set:
			return static_cast<const impl::xpath_variable_node_set*>(this)->name;

		case xpath_type_number:
			return static_cast<const impl::xpath_variable_number*>(this)->name;

		case xpath_type_string:
			return static_cast<const impl::xpath_variable_string*>(this)->name;

		case xpath_type_boolean:
			return static_cast<const impl::xpath_variable_boolean*>(this)->name;

		default:
			assert(false && "Invalid variable type"); // unreachable
			return 0;
		}
	}